

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O2

void __thiscall
duckdb::RowMatcher::Initialize
          (RowMatcher *this,bool no_match_sel,TupleDataLayout *layout,Predicates *predicates)

{
  const_reference type;
  const_reference pvVar1;
  ulong __n;
  MatchFunction local_50;
  
  ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::reserve
            ((vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_> *)this,
             (long)(predicates->
                   super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>).
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(predicates->
                   super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>).
                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                   ._M_impl.super__Vector_impl_data._M_start);
  for (__n = 0; __n < (ulong)((long)(predicates->
                                    super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                    ).
                                    super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(predicates->
                                   super_vector<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                   ).
                                   super__Vector_base<duckdb::ExpressionType,_std::allocator<duckdb::ExpressionType>_>
                                   ._M_impl.super__Vector_impl_data._M_start); __n = __n + 1) {
    type = vector<duckdb::LogicalType,_true>::get<true>(&layout->types,__n);
    pvVar1 = vector<duckdb::ExpressionType,_true>::get<true>(predicates,__n);
    GetMatchFunction(&local_50,this,no_match_sel,type,*pvVar1);
    ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::
    emplace_back<duckdb::MatchFunction>
              ((vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_> *)this,
               &local_50);
    ::std::vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>::~vector
              (&local_50.child_functions.
                super_vector<duckdb::MatchFunction,_std::allocator<duckdb::MatchFunction>_>);
  }
  return;
}

Assistant:

void RowMatcher::Initialize(const bool no_match_sel, const TupleDataLayout &layout, const Predicates &predicates) {
	match_functions.reserve(predicates.size());
	for (idx_t col_idx = 0; col_idx < predicates.size(); col_idx++) {
		match_functions.push_back(GetMatchFunction(no_match_sel, layout.GetTypes()[col_idx], predicates[col_idx]));
	}
}